

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_3DM_BIG_CHUNK>::Append(ON_SimpleArray<ON_3DM_BIG_CHUNK> *this,ON_3DM_BIG_CHUNK *x)

{
  int iVar1;
  ON_3DM_BIG_CHUNK *pOVar2;
  ON__UINT64 OVar3;
  ON__INT64 OVar4;
  ON__UINT64 OVar5;
  undefined8 uVar6;
  ON_3DM_BIG_CHUNK *pOVar7;
  ON__UINT32 OVar8;
  ON__UINT8 OVar9;
  ON__UINT8 OVar10;
  ON__UINT8 OVar11;
  ON__UINT8 OVar12;
  ON__UINT16 OVar13;
  ON_3DM_BIG_CHUNK *memblock;
  int iVar14;
  uint uVar15;
  
  iVar1 = this->m_count;
  memblock = x;
  if (iVar1 == this->m_capacity) {
    if ((iVar1 < 8) || ((ulong)((long)iVar1 * 0x28) < 0x10000001)) {
      uVar15 = 4;
      if (2 < iVar1) {
        uVar15 = iVar1 * 2;
      }
    }
    else {
      iVar14 = 0x66666e;
      if (iVar1 < 0x66666e) {
        iVar14 = iVar1;
      }
      uVar15 = iVar14 + iVar1;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_3DM_BIG_CHUNK *)onmalloc(0x28);
      OVar3 = x->m_end_offset;
      OVar4 = x->m_big_value;
      OVar8 = x->m_typecode;
      OVar9 = x->m_bLongChunk;
      OVar10 = x->m_reserved1;
      OVar11 = x->m_reserved2;
      OVar12 = x->m_reserved3;
      memblock->m_start_offset = x->m_start_offset;
      memblock->m_end_offset = OVar3;
      memblock->m_big_value = OVar4;
      memblock->m_typecode = OVar8;
      memblock->m_bLongChunk = OVar9;
      memblock->m_reserved1 = OVar10;
      memblock->m_reserved2 = OVar11;
      memblock->m_reserved3 = OVar12;
      OVar9 = x->m_do_crc32;
      OVar13 = x->m_crc16;
      OVar8 = x->m_crc32;
      memblock->m_do_crc16 = x->m_do_crc16;
      memblock->m_do_crc32 = OVar9;
      memblock->m_crc16 = OVar13;
      memblock->m_crc32 = OVar8;
    }
    if ((uint)this->m_capacity < uVar15) {
      SetCapacity(this,(long)(int)uVar15);
    }
    if (this->m_a == (ON_3DM_BIG_CHUNK *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pOVar2 = this->m_a;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  OVar9 = memblock->m_do_crc32;
  OVar13 = memblock->m_crc16;
  OVar8 = memblock->m_crc32;
  pOVar7 = pOVar2 + iVar1;
  pOVar7->m_do_crc16 = memblock->m_do_crc16;
  pOVar7->m_do_crc32 = OVar9;
  pOVar7->m_crc16 = OVar13;
  pOVar7->m_crc32 = OVar8;
  OVar3 = memblock->m_start_offset;
  OVar5 = memblock->m_end_offset;
  uVar6 = *(undefined8 *)&memblock->m_typecode;
  pOVar2[iVar1].m_big_value = memblock->m_big_value;
  (&pOVar2[iVar1].m_big_value)[1] = uVar6;
  pOVar2[iVar1].m_start_offset = OVar3;
  pOVar2[iVar1].m_end_offset = OVar5;
  if (memblock != x) {
    onfree(memblock);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}